

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void can_add_to_copies(_Bool copy_on_write)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  uint64_t uVar1;
  
  r = roaring_bitmap_create();
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | copy_on_write;
  roaring_bitmap_add(r,3);
  r_00 = roaring_bitmap_copy(r);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar1 == 1),"roaring_bitmap_get_cardinality(bm1) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x164);
  uVar1 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar1 == 1),"roaring_bitmap_get_cardinality(bm2) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x165);
  roaring_bitmap_add(r_00,4);
  roaring_bitmap_add(r,5);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar1 == 2),"roaring_bitmap_get_cardinality(bm1) == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x168);
  uVar1 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar1 == 2),"roaring_bitmap_get_cardinality(bm2) == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x169);
  roaring_bitmap_free(r);
  roaring_bitmap_free(r_00);
  return;
}

Assistant:

void can_add_to_copies(bool copy_on_write) {
    roaring_bitmap_t *bm1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(bm1, copy_on_write);
    roaring_bitmap_add(bm1, 3);
    roaring_bitmap_t *bm2 = roaring_bitmap_copy(bm1);
    assert_true(roaring_bitmap_get_cardinality(bm1) == 1);
    assert_true(roaring_bitmap_get_cardinality(bm2) == 1);
    roaring_bitmap_add(bm2, 4);
    roaring_bitmap_add(bm1, 5);
    assert_true(roaring_bitmap_get_cardinality(bm1) == 2);
    assert_true(roaring_bitmap_get_cardinality(bm2) == 2);
    roaring_bitmap_free(bm1);
    roaring_bitmap_free(bm2);
}